

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec75.c
# Opt level: O3

int Dau_DsdCheckDecAndExist_rec(char *pStr,char **p,int *pMatches,int *pnSupp)

{
  int iVar1;
  uint uVar2;
  byte *pbVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong *pnSupp_00;
  byte *pbVar13;
  int uSupp;
  ulong local_58 [5];
  
  pbVar13 = (byte *)*p;
  bVar4 = *pbVar13;
  pbVar3 = pbVar13;
  if (bVar4 == 0x21) {
    pbVar3 = pbVar13 + 1;
    *p = (char *)pbVar3;
    bVar4 = pbVar13[1];
  }
  if ((byte)(bVar4 + 0xbf) < 6 || (byte)(bVar4 - 0x30) < 10) {
    do {
      pbVar3 = pbVar3 + 1;
      *p = (char *)pbVar3;
      bVar4 = *pbVar3;
    } while ((byte)(bVar4 - 0x30) < 10 || (byte)(bVar4 + 0xbf) < 6);
  }
  if ((byte)(bVar4 + 0x9f) < 0x1a) {
    *pnSupp = *pnSupp + 1;
    uVar6 = 0;
  }
  else {
    if ((0x3f < bVar4 - 0x3c) || ((0x8000000080000001U >> ((ulong)(bVar4 - 0x3c) & 0x3f) & 1) == 0))
    {
      if (bVar4 != 0x28) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                      ,0xb6,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
      }
      local_58[2] = 0;
      local_58[3] = 0;
      local_58[0] = 0;
      local_58[1] = 0;
      if (pStr[pMatches[(long)pbVar3 - (long)pStr]] != ')') {
        __assert_fail("*q == **p + 1 + (**p != \'(\')",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                      ,0x8b,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
      }
      pbVar13 = (byte *)(pStr + pMatches[(long)pbVar3 - (long)pStr]);
      pbVar3 = pbVar3 + 1;
      *p = (char *)pbVar3;
      if (pbVar3 < pbVar13) {
        lVar7 = 0;
        pnSupp_00 = local_58;
        uVar2 = 0;
        uVar6 = 0;
        do {
          uVar5 = uVar6;
          uVar6 = Dau_DsdCheckDecAndExist_rec(pStr,p,pMatches,(int *)pnSupp_00);
          uVar2 = uVar2 | uVar6;
          iVar1 = (int)*pnSupp_00;
          *pnSupp = *pnSupp + iVar1;
          uVar6 = (iVar1 == 1) + uVar5;
          pbVar3 = (byte *)(*p + 1);
          *p = (char *)pbVar3;
          lVar7 = lVar7 + -1;
          pnSupp_00 = (ulong *)((long)pnSupp_00 + 4);
        } while (pbVar3 < pbVar13);
        if (pbVar3 == pbVar13) {
          if (lVar7 != -1) {
            if (uVar6 == 0) {
              return uVar2;
            }
            uVar8 = 1;
            uVar9 = 1 << ((byte)-lVar7 & 0x1f);
            if (1 < (int)uVar9) {
              do {
                uVar12 = 0;
                uVar10 = 0;
                do {
                  iVar11 = *(int *)((long)local_58 + uVar12 * 4);
                  if (1 < iVar11) {
                    if ((uVar8 >> ((uint)uVar12 & 0x1f) & 1) == 0) {
                      iVar11 = 0;
                    }
                    uVar10 = uVar10 + iVar11;
                  }
                  uVar12 = uVar12 + 1;
                } while ((-lVar7 & 0xffffffffU) != uVar12);
                if (8 < (int)uVar10) {
                  __assert_fail("Sum <= 8",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                                ,0x9d,
                                "int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
                }
                iVar11 = (iVar1 == 1) + uVar5;
                if (1 < (int)uVar10) {
                  do {
                    uVar2 = uVar2 | 1 << (uVar10 & 0x1f);
                    uVar10 = uVar10 + 1;
                    iVar11 = iVar11 + -1;
                  } while (iVar11 != 0);
                }
                uVar8 = uVar8 + 1;
              } while (uVar8 != uVar9);
            }
            if (uVar6 < 3) {
              return uVar2;
            }
            uVar6 = 2;
            do {
              uVar2 = uVar2 | 1 << (uVar6 & 0x1f);
              uVar6 = uVar6 + 1;
            } while (uVar5 + (iVar1 == 1) != uVar6);
            return uVar2;
          }
LAB_0039b659:
          __assert_fail("nParts > 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                        ,0x93,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
        }
      }
      else if (pbVar3 == pbVar13) goto LAB_0039b659;
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                    ,0x92,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
    }
    if (bVar4 + 2 != (int)pStr[pMatches[(long)pbVar3 - (long)pStr]]) {
      __assert_fail("*q == **p + 1 + (**p != \'(\')",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                    ,0xac,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
    }
    pbVar13 = (byte *)(pStr + pMatches[(long)pbVar3 - (long)pStr]);
    pbVar3 = pbVar3 + 1;
    *p = (char *)pbVar3;
    uVar6 = 0;
    if (pbVar3 < pbVar13) {
      uVar6 = 0;
      do {
        local_58[0] = local_58[0] & 0xffffffff00000000;
        uVar2 = Dau_DsdCheckDecAndExist_rec(pStr,p,pMatches,(int *)local_58);
        uVar6 = uVar6 | uVar2;
        *pnSupp = *pnSupp + (int)local_58[0];
        pbVar3 = (byte *)(*p + 1);
        *p = (char *)pbVar3;
      } while (pbVar3 < pbVar13);
    }
    if (pbVar3 != pbVar13) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                    ,0xb3,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
    }
  }
  return uVar6;
}

Assistant:

int Dau_DsdCheckDecAndExist_rec( char * pStr, char ** p, int * pMatches, int * pnSupp )
{
    if ( **p == '!' )
        (*p)++;
    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
        (*p)++;
    if ( **p >= 'a' && **p <= 'z' ) // var
    {
        (*pnSupp)++;
        return 0;
    }
    if ( **p == '(' ) // and
    {
        unsigned Mask = 0;
        int m, i, pSupps[8] = {0}, nParts = 0, nSimple = 0, nMints;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Mask |= Dau_DsdCheckDecAndExist_rec( pStr, p, pMatches, &pSupps[nParts] );
            nSimple += (pSupps[nParts] == 1);
            *pnSupp += pSupps[nParts++];
        }
        assert( *p == q );
        assert( nParts > 1 );
        if ( nSimple > 0 )
        {
            nMints = (1 << nParts);
            for ( m = 1; m < nMints; m++ )
            {
                int Sum = 0;
                for ( i = 0; i < nParts; i++ )
                    if ( pSupps[i] > 1 && ((m >> i) & 1) )
                        Sum += pSupps[i];
                assert( Sum <= 8 );
                if ( Sum >= 2 )
                    for ( i = 0; i < nSimple; i++ )
                        Mask |= (1 << (Sum + i));
            }
            for ( i = 2; i < nSimple; i++ )
                Mask |= (1 << i);
        }
        return Mask;
    }
    if ( **p == '<' || **p == '{' || **p == '[' ) // mux/xor/nondec
    {
        int uSupp;
        unsigned Mask = 0;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            uSupp = 0;
            Mask |= Dau_DsdCheckDecAndExist_rec( pStr, p, pMatches, &uSupp );
            *pnSupp += uSupp;
        }
        assert( *p == q );
        return Mask;
    }
    assert( 0 );
    return 0;
}